

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

wchar_t older(stat_conflict *st,archive_entry *entry)

{
  long lVar1;
  time_t tVar2;
  long lVar3;
  archive_entry *entry_local;
  stat_conflict *st_local;
  
  lVar1 = (st->st_mtim).tv_sec;
  tVar2 = archive_entry_mtime(entry);
  if (lVar1 < tVar2) {
    st_local._4_4_ = L'\x01';
  }
  else {
    lVar1 = (st->st_mtim).tv_sec;
    tVar2 = archive_entry_mtime(entry);
    if (tVar2 < lVar1) {
      st_local._4_4_ = L'\0';
    }
    else {
      lVar1 = (st->st_mtim).tv_nsec;
      lVar3 = archive_entry_mtime_nsec(entry);
      if (lVar1 < lVar3) {
        st_local._4_4_ = L'\x01';
      }
      else {
        st_local._4_4_ = L'\0';
      }
    }
  }
  return st_local._4_4_;
}

Assistant:

static int
older(struct stat *st, struct archive_entry *entry)
{
	/* First, test the seconds and return if we have a definite answer. */
	/* Definitely older. */
	if (st->st_mtime < archive_entry_mtime(entry))
		return (1);
	/* Definitely younger. */
	if (st->st_mtime > archive_entry_mtime(entry))
		return (0);
	/* If this platform supports fractional seconds, try those. */
#if HAVE_STRUCT_STAT_ST_MTIMESPEC_TV_NSEC
	/* Definitely older. */
	if (st->st_mtimespec.tv_nsec < archive_entry_mtime_nsec(entry))
		return (1);
#elif HAVE_STRUCT_STAT_ST_MTIM_TV_NSEC
	/* Definitely older. */
	if (st->st_mtim.tv_nsec < archive_entry_mtime_nsec(entry))
		return (1);
#elif HAVE_STRUCT_STAT_ST_MTIME_N
	/* older. */
	if (st->st_mtime_n < archive_entry_mtime_nsec(entry))
		return (1);
#elif HAVE_STRUCT_STAT_ST_UMTIME
	/* older. */
	if (st->st_umtime * 1000 < archive_entry_mtime_nsec(entry))
		return (1);
#elif HAVE_STRUCT_STAT_ST_MTIME_USEC
	/* older. */
	if (st->st_mtime_usec * 1000 < archive_entry_mtime_nsec(entry))
		return (1);
#else
	/* This system doesn't have high-res timestamps. */
#endif
	/* Same age or newer, so not older. */
	return (0);
}